

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

size_t google::protobuf::internal::VarintSize<false,true,int>(int *data,int n)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint32 sum;
  ulong uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  
  uVar3 = 0;
  uVar4 = 0;
  if (0 < n) {
    uVar4 = (ulong)(uint)n;
  }
  iVar5 = 0;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = data[uVar3];
    auVar6._0_4_ = -(uint)(-0x7fffff81 < (int)(uVar1 ^ 0x80000000));
    auVar6._4_4_ = -(uint)(-0x7fffc001 < (int)(uVar1 ^ 0x80000000));
    auVar6._8_4_ = -(uint)(-0x7fe00001 < (int)(uVar1 ^ 0x80000000));
    auVar6._12_4_ = -(uint)(-0x70000001 < (int)(uVar1 ^ 0x80000000));
    iVar2 = movmskps(uVar1,auVar6);
    iVar5 = iVar5 - ((int)uVar1 >> 0x1f);
    n = n + ((uint)(0x4332322132212110 >> ((byte)(iVar2 << 2) & 0x3f)) & 7);
  }
  return (ulong)(uint)(n + iVar5 * 5);
}

Assistant:

static size_t VarintSize(const T* data, const int n) {
#if __cplusplus >= 201103L
  static_assert(sizeof(T) == 4, "This routine only works for 32 bit integers");
  // is_unsigned<T> => !ZigZag
  static_assert(
      (std::is_unsigned<T>::value ^ ZigZag) || std::is_signed<T>::value,
      "Cannot ZigZag encode unsigned types");
  // is_unsigned<T> => !SignExtended
  static_assert(
      (std::is_unsigned<T>::value ^ SignExtended) || std::is_signed<T>::value,
      "Cannot SignExtended unsigned types");
  static_assert(!(SignExtended && ZigZag),
                "Cannot SignExtended and ZigZag on the same type");
#endif
  uint32 sum = n;
  uint32 msb_sum = 0;
  for (int i = 0; i < n; i++) {
    uint32 x = data[i];
    if (ZigZag) {
      x = WireFormatLite::ZigZagEncode32(x);
    } else if (SignExtended) {
      msb_sum += x >> 31;
    }
    // clang is so smart that it produces optimal SSE sequence unrolling
    // the loop 8 ints at a time. With a sequence of 4
    // cmpres = cmpgt x, sizeclass  ( -1 or 0)
    // sum = sum - cmpres
    if (x > 0x7F) sum++;
    if (x > 0x3FFF) sum++;
    if (x > 0x1FFFFF) sum++;
    if (x > 0xFFFFFFF) sum++;
  }
  if (SignExtended) sum += msb_sum * 5;
  return sum;
}